

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O0

Duration * __thiscall absl::lts_20250127::Duration::operator/=(Duration *this,int64_t r)

{
  bool bVar1;
  int64_t iVar2;
  Duration DVar3;
  HiRep local_d0;
  uint32_t local_c8;
  HiRep local_98;
  uint32_t local_90;
  HiRep local_88;
  uint32_t local_80;
  HiRep local_4c;
  uint32_t local_44;
  bool is_neg;
  int64_t r_local;
  Duration *this_local;
  
  bVar1 = time_internal::IsInfiniteDuration(*this);
  if ((bVar1) || (r == 0)) {
    iVar2 = HiRep::Get(&this->rep_hi_);
    if (r < 0 == iVar2 < 0) {
      DVar3 = InfiniteDuration();
      local_98 = DVar3.rep_hi_;
      local_4c = local_98;
      local_90 = DVar3.rep_lo_;
      local_44 = local_90;
    }
    else {
      DVar3 = InfiniteDuration();
      DVar3 = lts_20250127::operator-(DVar3);
      local_88 = DVar3.rep_hi_;
      local_4c = local_88;
      local_80 = DVar3.rep_lo_;
      local_44 = local_80;
    }
    this->rep_hi_ = local_4c;
    this->rep_lo_ = local_44;
  }
  else {
    DVar3.rep_hi_.hi_ = 0;
    DVar3.rep_hi_.lo_ = this->rep_lo_;
    DVar3.rep_lo_ = (uint32_t)r;
    DVar3 = anon_unknown_1::ScaleFixed<std::divides>
                      ((anon_unknown_1 *)this->rep_hi_,DVar3,(ulong)this->rep_lo_);
    local_d0 = DVar3.rep_hi_;
    local_c8 = DVar3.rep_lo_;
    this->rep_hi_ = local_d0;
    this->rep_lo_ = local_c8;
  }
  return this;
}

Assistant:

Duration& Duration::operator/=(int64_t r) {
  if (time_internal::IsInfiniteDuration(*this) || r == 0) {
    const bool is_neg = (r < 0) != (rep_hi_.Get() < 0);
    return *this = is_neg ? -InfiniteDuration() : InfiniteDuration();
  }
  return *this = ScaleFixed<std::divides>(*this, r);
}